

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prevector.h
# Opt level: O0

bool __thiscall
prevector<16U,_unsigned_char,_unsigned_int,_int>::operator<
          (prevector<16U,_unsigned_char,_unsigned_int,_int> *this,
          prevector<16U,_unsigned_char,_unsigned_int,_int> *other)

{
  long lVar1;
  const_iterator x;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  byte *pbVar5;
  long in_FS_OFFSET;
  const_iterator e1;
  const_iterator b2;
  const_iterator b1;
  const_iterator *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  uint in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined1 local_29;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = size((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  sVar4 = size((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  if (sVar3 < sVar4) {
    local_29 = true;
  }
  else {
    sVar3 = size((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    sVar4 = size((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                 CONCAT44(sVar3,in_stack_ffffffffffffffa8));
    if (sVar4 < sVar3) {
      local_29 = false;
    }
    else {
      begin((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      begin((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
            CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      end((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      while( true ) {
        x.ptr._4_4_ = sVar3;
        x.ptr._0_4_ = in_stack_ffffffffffffffa8;
        bVar2 = const_iterator::operator!=
                          ((const_iterator *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),x);
        if (!bVar2) break;
        pbVar5 = const_iterator::operator*(in_stack_ffffffffffffff98);
        in_stack_ffffffffffffffa8 = (uint)*pbVar5;
        pbVar5 = const_iterator::operator*(in_stack_ffffffffffffff98);
        if ((int)in_stack_ffffffffffffffa8 < (int)(uint)*pbVar5) {
          local_29 = true;
          goto LAB_019842c7;
        }
        pbVar5 = const_iterator::operator*(in_stack_ffffffffffffff98);
        in_stack_ffffffffffffffa4 = (uint)*pbVar5;
        pbVar5 = const_iterator::operator*(in_stack_ffffffffffffff98);
        if ((int)in_stack_ffffffffffffffa4 < (int)(uint)*pbVar5) {
          local_29 = false;
          goto LAB_019842c7;
        }
        const_iterator::operator++(in_stack_ffffffffffffff98);
        const_iterator::operator++(in_stack_ffffffffffffff98);
      }
      local_29 = false;
    }
  }
LAB_019842c7:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_29;
  }
  __stack_chk_fail();
}

Assistant:

bool operator<(const prevector<N, T, Size, Diff>& other) const {
        if (size() < other.size()) {
            return true;
        }
        if (size() > other.size()) {
            return false;
        }
        const_iterator b1 = begin();
        const_iterator b2 = other.begin();
        const_iterator e1 = end();
        while (b1 != e1) {
            if ((*b1) < (*b2)) {
                return true;
            }
            if ((*b2) < (*b1)) {
                return false;
            }
            ++b1;
            ++b2;
        }
        return false;
    }